

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O1

int file_read(void *buf,size_t size,FILE *file)

{
  uint uVar1;
  FILE *pFVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uint *puVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar4 = feof((FILE *)file);
  if ((iVar4 == 0) && (size != 0)) {
    uVar10 = 0;
    uVar1 = 0;
    do {
      uVar9 = uVar1;
      sVar6 = fread((void *)((long)buf + uVar10),1,size - uVar10,(FILE *)file);
      uVar10 = sVar6 + uVar10;
      uVar5 = ferror((FILE *)file);
      bVar3 = false;
      if (uVar5 != 0) {
        puVar7 = (uint *)__errno_location();
        pFVar2 = _stderr;
        uVar1 = *puVar7;
        if ((uVar1 == 0xb) || (uVar1 == 4)) {
          clearerr((FILE *)file);
          bVar3 = false;
        }
        else {
          pcVar8 = strerror(uVar1);
          fprintf(pFVar2,"Error reading file: %u of %u bytes read, %d: %s\n",uVar10 & 0xffffffff,
                  size & 0xffffffff,(ulong)uVar1,pcVar8);
          bVar3 = true;
        }
      }
      if (bVar3) {
        return 0;
      }
      iVar4 = feof((FILE *)file);
    } while (((iVar4 == 0) && (uVar10 < size)) && (uVar1 = uVar9 + 1, uVar9 < 4));
    uVar9 = uVar9 + 1;
  }
  else {
    uVar9 = 0;
    uVar5 = 0;
    uVar10 = 0;
  }
  iVar4 = feof((FILE *)file);
  pFVar2 = _stderr;
  if ((iVar4 == 0) && (uVar10 != size)) {
    puVar7 = (uint *)__errno_location();
    uVar1 = *puVar7;
    pcVar8 = strerror(uVar1);
    fprintf(pFVar2,"Error reading file: %u of %u bytes read, error: %d, tries: %d, %d: %s\n",
            uVar10 & 0xffffffff,size & 0xffffffff,(ulong)uVar5,(ulong)uVar9,(ulong)uVar1,pcVar8);
  }
  return (uint)(uVar10 == size);
}

Assistant:

static int file_read(void *buf, size_t size, FILE *file) {
  const int kMaxTries = 5;
  int try_count = 0;
  int file_error = 0;
  size_t len = 0;
  while (!feof(file) && len < size && try_count < kMaxTries) {
    const size_t n = fread((uint8_t *)buf + len, 1, size - len, file);
    ++try_count;
    len += n;
    file_error = ferror(file);
    if (file_error) {
      if (errno == EINTR || errno == EAGAIN) {
        clearerr(file);
        continue;
      } else {
        fprintf(stderr, "Error reading file: %u of %u bytes read, %d: %s\n",
                (uint32_t)len, (uint32_t)size, errno, strerror(errno));
        return 0;
      }
    }
  }

  if (!feof(file) && len != size) {
    fprintf(stderr,
            "Error reading file: %u of %u bytes read,"
            " error: %d, tries: %d, %d: %s\n",
            (uint32_t)len, (uint32_t)size, file_error, try_count, errno,
            strerror(errno));
  }
  return len == size;
}